

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

Own<capnp::TwoPartyServer::AcceptedConnection> __thiscall
kj::
heap<capnp::TwoPartyServer::AcceptedConnection,capnp::Capability::Client&,kj::Own<kj::AsyncIoStream>>
          (kj *this,Client *params,Own<kj::AsyncIoStream> *params_1)

{
  ClientHook *pCVar1;
  AcceptedConnection *pAVar2;
  AcceptedConnection *extraout_RDX;
  AcceptedConnection *extraout_RDX_00;
  Own<capnp::TwoPartyServer::AcceptedConnection> OVar3;
  Client local_38;
  
  pAVar2 = (AcceptedConnection *)operator_new(0x1a0);
  (*((params->hook).ptr)->_vptr_ClientHook[4])(&local_38);
  capnp::TwoPartyServer::AcceptedConnection::AcceptedConnection(pAVar2,&local_38,params_1);
  pCVar1 = local_38.hook.ptr;
  *(undefined8 **)this = &_::HeapDisposer<capnp::TwoPartyServer::AcceptedConnection>::instance;
  *(AcceptedConnection **)(this + 8) = pAVar2;
  pAVar2 = extraout_RDX;
  if (local_38.hook.ptr != (ClientHook *)0x0) {
    local_38.hook.ptr = (ClientHook *)0x0;
    (**(local_38.hook.disposer)->_vptr_Disposer)
              (local_38.hook.disposer,pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook
              );
    pAVar2 = extraout_RDX_00;
  }
  OVar3.ptr = pAVar2;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}